

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O2

void AbslInternalSleepFor_lts_20250127(Duration duration)

{
  Duration rhs;
  int iVar1;
  Duration *pDVar2;
  int *piVar3;
  undefined8 extraout_RDX;
  Duration d;
  timespec local_48;
  Duration local_38;
  
  local_38.rep_lo_ = duration.rep_lo_;
  local_38.rep_hi_ = duration.rep_hi_;
  do {
    if (local_38.rep_hi_ == (HiRep)0x0) {
      if (local_38.rep_lo_ == 0) {
        return;
      }
    }
    else if ((long)local_38.rep_hi_ < 1) {
      return;
    }
    local_48._0_12_ = ZEXT812(0x7fffffffffffffff);
    pDVar2 = std::min<absl::lts_20250127::Duration>(&local_38,(Duration *)&local_48);
    rhs = *pDVar2;
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = pDVar2->rep_lo_;
    d.rep_lo_ = (uint32_t)extraout_RDX;
    local_48 = absl::lts_20250127::ToTimespec((lts_20250127 *)pDVar2->rep_hi_,d);
    do {
      iVar1 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
      if (iVar1 == 0) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    absl::lts_20250127::Duration::operator-=(&local_38,rhs);
  } while( true );
}

Assistant:

ABSL_ATTRIBUTE_WEAK void ABSL_INTERNAL_C_SYMBOL(AbslInternalSleepFor)(
    absl::Duration duration) {
  while (duration > absl::ZeroDuration()) {
    absl::Duration to_sleep = std::min(duration, absl::MaxSleep());
    absl::SleepOnce(to_sleep);
    duration -= to_sleep;
  }
}